

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall higan::HttpResponse::HttpResponse(HttpResponse *this,bool close_connection)

{
  _Rb_tree_header *p_Var1;
  
  this->close_connection_ = close_connection;
  (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->header_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Buffer::Buffer(&this->body_buffer_);
  (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

HttpResponse::HttpResponse(bool close_connection):
	close_connection_(close_connection),
	body_buffer_(),
	file_ptr_()
{
}